

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O3

void print_instsv_table(dlog_mt_install_params_t *instsv_table)

{
  byte bVar1;
  char phone_number_string [21];
  char acStack_28 [24];
  
  phone_num_to_string(acStack_28,0x15,instsv_table->access_code,4);
  printf("             Access code: %s\n",acStack_28);
  phone_num_to_string(acStack_28,0x15,instsv_table->key_card_number,5);
  printf("         Key card number: %s\n",acStack_28);
  printf("                   flags: 0x%02x\t",(ulong)instsv_table->flags);
  print_bits(instsv_table->flags,instsv_flags_bits_str);
  putchar(10);
  bVar1 = instsv_table->tx_packet_delay;
  printf("         TX Packet Delay: 0x%02x (%dms)\n",(ulong)bVar1,
         (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  bVar1 = instsv_table->rx_packet_gap;
  printf("           RX Packet Gap: 0x%02x (%dms)\n",(ulong)bVar1,
         (ulong)(((uint)bVar1 + (uint)bVar1) * 5));
  printf("       Retries until OOS: %d\n",(ulong)instsv_table->retries_until_oos);
  printf("      Coin service flags: 0x%02x\n",(ulong)instsv_table->coin_service_flags);
  printf("    Coinbox lock timeout: %d seconds\n",(ulong)instsv_table->coinbox_lock_timeout);
  callscrn_num_to_string(acStack_28,0x15,instsv_table->predial_string,4);
  printf("          Predial string: %s\n",acStack_28);
  callscrn_num_to_string(acStack_28,0x15,instsv_table->predial_string_alt,4);
  printf("Alternate Predial string: %s\n",acStack_28);
  return;
}

Assistant:

void print_instsv_table(dlog_mt_install_params_t* instsv_table) {
    char phone_number_string[21];

    printf("             Access code: %s\n",
        phone_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->access_code, sizeof(instsv_table->access_code)));
    printf("         Key card number: %s\n",
        phone_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->key_card_number, sizeof(instsv_table->key_card_number)));
    printf("                   flags: 0x%02x\t", instsv_table->flags);
    print_bits(instsv_table->flags, (char**)instsv_flags_bits_str);
    printf("\n");
    printf("         TX Packet Delay: 0x%02x (%dms)\n",
        instsv_table->tx_packet_delay, instsv_table->tx_packet_delay * 10);
    printf("           RX Packet Gap: 0x%02x (%dms)\n",
        instsv_table->rx_packet_gap, instsv_table->rx_packet_gap * 10);
    printf("       Retries until OOS: %d\n", instsv_table->retries_until_oos);
    printf("      Coin service flags: 0x%02x\n", instsv_table->coin_service_flags);
    printf("    Coinbox lock timeout: %d seconds\n", LE16(instsv_table->coinbox_lock_timeout));
    printf("          Predial string: %s\n",
        callscrn_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->predial_string, sizeof(instsv_table->predial_string)));
    printf("Alternate Predial string: %s\n",
        callscrn_num_to_string(phone_number_string, sizeof(phone_number_string),
            instsv_table->predial_string_alt, sizeof(instsv_table->predial_string_alt)));
}